

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:6958:23)>
::getImpl(SimpleTransformPromiseNode<kj::HttpClient::ConnectRequest::Status,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:6958:23)>
          *this,ExceptionOrValue *output)

{
  AsyncIoStream *pAVar1;
  PromiseArena *pPVar2;
  SourceLocation location;
  SourceLocation location_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar3;
  void *pvVar4;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:6966:15)>
  *location_01;
  StringPtr expected;
  undefined1 local_4a0 [8];
  Fault f;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_480;
  ArrayBuilder<kj::Promise<void>_> promises;
  bool local_450;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_438;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_428;
  char *local_420;
  char *pcStack_418;
  undefined8 local_410;
  Array<kj::Promise<void>_> result;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_3f0;
  Status local_3e8;
  ExceptionOr<kj::Promise<void>_> local_3a8;
  ExceptionOr<kj::HttpClient::ConnectRequest::Status> depResult;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_3a8,
               &depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_3a8.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3a8)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_3a8);
  }
  else if (depResult.value.ptr.isSet == true) {
    HttpClient::ConnectRequest::Status::Status(&local_3e8,&depResult.value.ptr.field_1.value);
    promises.pos = (RemoveConst<kj::Promise<void>_> *)CONCAT44(promises.pos._4_4_,200);
    promises.endPtr = (Promise<void> *)anon_var_dwarf_4fea7;
    promises.disposer = (ArrayDisposer *)&DAT_00000005;
    promises.ptr = (Promise<void> *)&local_3e8;
    if (local_3e8.statusCode != 200) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x1b2f,FAILED,"status.statusCode == 200","_kjCondition,",
                 (DebugComparison<unsigned_int_&,_int> *)&promises);
      Debug::Fault::fatal(&f);
    }
    result.ptr = (Promise<void> *)&local_3e8.statusText;
    f.exception = (Exception *)0x45614d;
    DebugExpression<kj::String&>::operator==
              ((DebugComparison<kj::String_&,_kj::StringPtr> *)&promises,
               (DebugExpression<kj::String&> *)&result,(StringPtr *)&f);
    if (local_450 == false) {
      Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<kj::String&,kj::StringPtr>&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x1b30,FAILED,"status.statusText == \"OK\"_kj","_kjCondition,",
                 (DebugComparison<kj::String_&,_kj::StringPtr> *)&promises);
      Debug::Fault::fatal(&f);
    }
    promises.ptr = HeapArrayDisposer::allocateUninitialized<kj::Promise<void>>(2);
    promises.endPtr = promises.ptr + 2;
    promises.disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
    pAVar1 = (this->func).io.ptr;
    promises.pos = promises.ptr;
    (**(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
              (&f,&pAVar1->super_AsyncOutputStream,"hello",5);
    ((promises.pos)->super_PromiseBase).node.ptr = (PromiseNode *)f.exception;
    f.exception = (Exception *)0x0;
    promises.pos = promises.pos + 1;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
    expected.content.size_ = (size_t)"hello";
    expected.content.ptr = (char *)(this->func).io.ptr;
    kj::anon_unknown_0::expectRead((AsyncInputStream *)&f,expected);
    ((promises.pos)->super_PromiseBase).node.ptr = (PromiseNode *)f.exception;
    f.exception = (Exception *)0x0;
    promises.pos = promises.pos + 1;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&f);
    result.size_ = (long)promises.pos - (long)promises.ptr >> 3;
    result.ptr = promises.ptr;
    result.disposer = promises.disposer;
    promises.endPtr = (Promise<void> *)0x0;
    promises.ptr = (Promise<void> *)0x0;
    promises.pos = (RemoveConst<kj::Promise<void>_> *)0x0;
    local_420 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
    ;
    pcStack_418 = "operator()";
    local_410 = 0xc00001b35;
    location.function = "operator()";
    location.fileName =
         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
    ;
    location.lineNumber = 0x1b35;
    location.columnNumber = 0xc;
    joinPromises((Array<kj::Promise<void>_> *)local_4a0,location);
    local_438.disposer = (this->func).io.disposer;
    local_438.ptr = (this->func).io.ptr;
    (this->func).io.ptr = (AsyncIoStream *)0x0;
    continuationTracePtr =
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++:6966:15)>
         ::anon_class_16_1_3fcf65e4_for_func::operator();
    pPVar2 = ((PromiseArenaMember *)local_4a0)->arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)local_4a0 - (long)pPVar2) < 0x30) {
      pvVar4 = operator_new(0x400);
      location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:6966:15)>
                     *)((long)pvVar4 + 0x3d0);
      kj::operator()(location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_4a0,
                     (anon_class_16_1_3fcf65e4_for_func *)&local_438,&continuationTracePtr);
      *(void **)((long)pvVar4 + 0x3d8) = pvVar4;
    }
    else {
      ((PromiseArenaMember *)local_4a0)->arena = (PromiseArena *)0x0;
      location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_test_c__:6966:15)>
                     *)((long)local_4a0 + -0x30);
      kj::operator()(location_01,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_4a0,
                     (anon_class_16_1_3fcf65e4_for_func *)&local_438,&continuationTracePtr);
      (((PromiseNode *)((long)local_4a0 + -0x30))->super_PromiseArenaMember).arena = pPVar2;
    }
    f.exception = (Exception *)&DAT_003d3151;
    location_00.function = &DAT_003d31b0;
    location_00.fileName = &DAT_003d3151;
    location_00.lineNumber = 0x58b;
    location_00.columnNumber = 0x4c;
    intermediate.ptr = (PromiseNode *)location_01;
    maybeChain<void>((OwnPromiseNode *)&local_428.value,(Promise<void> *)&intermediate,location_00);
    aVar3 = local_428;
    local_428 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_428.value);
    local_480 = aVar3;
    local_3f0.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_3f0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
    Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_438);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_4a0);
    Array<kj::Promise<void>_>::~Array(&result);
    ArrayBuilder<kj::Promise<void>_>::dispose(&promises);
    HttpClient::ConnectRequest::Status::~Status(&local_3e8);
    local_3a8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_3a8.value.ptr.isSet = true;
    local_3a8.value.ptr.field_1 = aVar3;
    local_480 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_3a8)
    ;
    ExceptionOr<kj::Promise<void>_>::~ExceptionOr(&local_3a8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_480.value);
  }
  ExceptionOr<kj::HttpClient::ConnectRequest::Status>::~ExceptionOr(&depResult);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }